

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::EmitNon32BitOvfCheck(Instr *instr,Instr *insertInstr,LabelInstr *bailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  RegOpnd *this;
  Instr *pIVar5;
  RegOpnd *dstOpnd;
  IntConstOpnd *pIVar6;
  uint8 shamt;
  RegOpnd *temp;
  Instr *newInstr;
  RegOpnd *edxSym;
  LabelInstr *bailOutLabel_local;
  Instr *insertInstr_local;
  Instr *instr_local;
  
  if (instr->m_opcode != IMUL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c01,"(instr->m_opcode == Js::OpCode::IMUL)",
                       "IMUL should be used to check for non-32 bit overflow check on x86.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = IR::RegOpnd::New(TyInt32,instr->m_func);
  IR::RegOpnd::SetReg(this,RegArg2);
  pIVar5 = IR::Instr::New(NOP,&this->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
  if (instr->ignoreOverflowBitCount < 0x21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c0f,"(instr->ignoreOverflowBitCount > 32)",
                       "instr->ignoreOverflowBitCount > 32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = 0x40 - instr->ignoreOverflowBitCount;
  pIVar5 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,&this->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar6 = IR::IntConstOpnd::New((ulong)bVar3,TyInt8,instr->m_func,true);
  pIVar5 = IR::Instr::New(SHL,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar6->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar6 = IR::IntConstOpnd::New((ulong)bVar3,TyInt8,instr->m_func,true);
  pIVar5 = IR::Instr::New(SAR,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar6->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar5 = IR::Instr::New(CMP,instr->m_func);
  IR::Instr::SetSrc1(pIVar5,&dstOpnd->super_Opnd);
  IR::Instr::SetSrc2(pIVar5,&this->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  Lowerer::InsertBranch(JNE,false,bailOutLabel,insertInstr);
  return;
}

Assistant:

void
LowererMD::EmitNon32BitOvfCheck(IR::Instr *instr, IR::Instr *insertInstr, IR::LabelInstr* bailOutLabel)
{
    AssertMsg(instr->m_opcode == Js::OpCode::IMUL, "IMUL should be used to check for non-32 bit overflow check on x86.");

    IR::RegOpnd *edxSym = IR::RegOpnd::New(TyInt32, instr->m_func);
#ifdef _M_IX86
    edxSym->SetReg(RegEDX);
#else
    edxSym->SetReg(RegRDX);
#endif

    // dummy def for edx to force RegAlloc to generate a lifetime. This is removed later by the Peeps phase.
    IR::Instr *newInstr = IR::Instr::New(Js::OpCode::NOP, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    IR::RegOpnd *temp = IR::RegOpnd::New(TyInt32, instr->m_func);
    Assert(instr->ignoreOverflowBitCount > 32);
    uint8 shamt = 64 - instr->ignoreOverflowBitCount;

    // MOV temp, edx
    newInstr = IR::Instr::New(Js::OpCode::MOV, temp, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SHL temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SHL, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SAR temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SAR, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // CMP temp, edx
    newInstr = IR::Instr::New(Js::OpCode::CMP, instr->m_func);
    newInstr->SetSrc1(temp);
    newInstr->SetSrc2(edxSym);
    insertInstr->InsertBefore(newInstr);

    // JNE
    Lowerer::InsertBranch(Js::OpCode::JNE, false, bailOutLabel, insertInstr);
}